

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O0

void __thiscall
draco::RAnsSymbolEncoder<15>::EndEncoding(RAnsSymbolEncoder<15> *this,EncoderBuffer *buffer)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  RAnsEncoder<20> *in_RDI;
  char *dst;
  uint32_t size_len;
  EncoderBuffer var_size_buffer;
  uint64_t bytes_written;
  char *src;
  undefined1 *nbytes;
  EncoderBuffer *in_stack_ffffffffffffff80;
  EncoderBuffer *this_00;
  undefined1 local_50 [48];
  size_t local_20;
  EncoderBuffer *local_18;
  
  pcVar2 = EncoderBuffer::data((EncoderBuffer *)0x28c0ab);
  local_18 = (EncoderBuffer *)(pcVar2 + *(long *)&in_RDI[3].ans_.buf_offset);
  iVar1 = RAnsEncoder<20>::write_end(in_RDI);
  local_20 = (size_t)iVar1;
  EncoderBuffer::EncoderBuffer(in_stack_ffffffffffffff80);
  EncodeVarint<unsigned_long>((unsigned_long)in_RDI,in_stack_ffffffffffffff80);
  nbytes = local_50;
  sVar3 = EncoderBuffer::size((EncoderBuffer *)0x28c0fa);
  memmove(&(local_18->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Tp_alloc_type + (sVar3 & 0xffffffff),local_18,local_20);
  this_00 = local_18;
  pcVar2 = EncoderBuffer::data((EncoderBuffer *)0x28c136);
  memcpy(this_00,pcVar2,sVar3 & 0xffffffff);
  EncoderBuffer::Resize(this_00,(int64_t)nbytes);
  EncoderBuffer::~EncoderBuffer(this_00);
  return;
}

Assistant:

void RAnsSymbolEncoder<unique_symbols_bit_length_t>::EndEncoding(
    EncoderBuffer *buffer) {
  char *const src = const_cast<char *>(buffer->data()) + buffer_offset_;

  // TODO(fgalligan): Look into changing this to uint32_t as write_end()
  // returns an int.
  const uint64_t bytes_written = static_cast<uint64_t>(ans_.write_end());
  EncoderBuffer var_size_buffer;
  EncodeVarint(bytes_written, &var_size_buffer);
  const uint32_t size_len = static_cast<uint32_t>(var_size_buffer.size());
  char *const dst = src + size_len;
  memmove(dst, src, bytes_written);

  // Store the size of the encoded data.
  memcpy(src, var_size_buffer.data(), size_len);

  // Resize the buffer to match the number of encoded bytes.
  buffer->Resize(buffer_offset_ + bytes_written + size_len);
}